

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall mkvmuxer::Chapters::ExpandChaptersArray(Chapters *this)

{
  int iVar1;
  uint uVar2;
  Chapter *pCVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  ulong *puVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  
  iVar1 = this->chapters_size_;
  uVar2 = this->chapters_count_;
  bVar5 = true;
  if (iVar1 <= (int)uVar2) {
    iVar8 = 1;
    if (iVar1 != 0) {
      iVar8 = iVar1 * 2;
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)iVar8;
    uVar7 = 0xffffffffffffffff;
    if (SUB168(auVar4 * ZEXT816(0x30),8) == 0) {
      uVar7 = SUB168(auVar4 * ZEXT816(0x30),0) | 8;
    }
    puVar6 = (ulong *)operator_new__(uVar7,(nothrow_t *)&std::nothrow);
    uVar7 = 0;
    if (puVar6 == (ulong *)0x0) {
      bVar5 = false;
    }
    else {
      *puVar6 = (long)iVar8;
      pCVar3 = this->chapters_;
      uVar9 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar9 = uVar7;
      }
      for (; uVar9 * 0x30 - uVar7 != 0; uVar7 = uVar7 + 0x30) {
        Chapter::ShallowCopy
                  ((Chapter *)((long)&pCVar3->id_ + uVar7),
                   (Chapter *)((long)&((Chapter *)(puVar6 + 1))->id_ + uVar7));
      }
      if (pCVar3 != (Chapter *)0x0) {
        operator_delete__(&pCVar3[-1].displays_size_);
      }
      this->chapters_ = (Chapter *)(puVar6 + 1);
      this->chapters_size_ = iVar8;
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

bool Chapters::ExpandChaptersArray() {
  if (chapters_size_ > chapters_count_)
    return true;  // nothing to do yet

  const int size = (chapters_size_ == 0) ? 1 : 2 * chapters_size_;

  Chapter* const chapters = new (std::nothrow) Chapter[size];  // NOLINT
  if (chapters == NULL)
    return false;

  for (int idx = 0; idx < chapters_count_; ++idx) {
    const Chapter& src = chapters_[idx];
    Chapter* const dst = chapters + idx;
    src.ShallowCopy(dst);
  }

  delete[] chapters_;

  chapters_ = chapters;
  chapters_size_ = size;

  return true;
}